

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlugInManager.cpp
# Opt level: O2

void __thiscall CppUnit::PlugInManager::unload(PlugInManager *this,string *libraryFileName)

{
  __type _Var1;
  _Elt_pointer pPVar2;
  PlugInManager *this_00;
  _Map_pointer ppPVar3;
  PlugInManager *plugIn;
  const_iterator local_80;
  iterator local_60;
  PlugIns *local_40;
  PlugInManager *local_38;
  
  local_40 = &this->m_plugIns;
  plugIn = (PlugInManager *)
           (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_cur;
  pPVar2 = (this->m_plugIns).
           super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
           ._M_impl.super__Deque_impl_data._M_start._M_last;
  ppPVar3 = (this->m_plugIns).
            super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
            ._M_impl.super__Deque_impl_data._M_start._M_node;
  local_38 = (PlugInManager *)
             (this->m_plugIns).
             super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
             ._M_impl.super__Deque_impl_data._M_start._M_first;
  while( true ) {
    if (plugIn == (PlugInManager *)
                  (this->m_plugIns).
                  super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_cur) {
      return;
    }
    this_00 = plugIn;
    _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            plugIn,libraryFileName);
    if (_Var1) break;
    plugIn = (PlugInManager *)
             &(plugIn->m_plugIns).
              super__Deque_base<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>
              ._M_impl.super__Deque_impl_data._M_start._M_node;
    if (plugIn == (PlugInManager *)pPVar2) {
      plugIn = (PlugInManager *)ppPVar3[1];
      ppPVar3 = ppPVar3 + 1;
      pPVar2 = (_Elt_pointer)
               ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)&plugIn[5].m_plugIns + 2);
      local_38 = plugIn;
    }
  }
  unload(this_00,(PlugInInfo *)plugIn);
  local_80._M_first = (_Elt_pointer)local_38;
  local_80._M_cur = (_Elt_pointer)plugIn;
  local_80._M_last = pPVar2;
  local_80._M_node = ppPVar3;
  std::
  deque<CppUnit::PlugInManager::PlugInInfo,_std::allocator<CppUnit::PlugInManager::PlugInInfo>_>::
  erase(&local_60,local_40,&local_80);
  return;
}

Assistant:

void 
PlugInManager::unload( const std::string &libraryFileName )
{
  for ( PlugIns::iterator it = m_plugIns.begin(); it != m_plugIns.end(); ++it )
  {
    if ( (*it).m_fileName == libraryFileName )
    {
      unload( *it );
      m_plugIns.erase( it );
      break;
    }
  }
}